

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O0

float miniply::angle_at_vert
                (uint32_t idx,vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *points2D,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *prev,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *next)

{
  Vec2 lhs;
  Vec2 rhs;
  const_reference pvVar1;
  const_reference pvVar2;
  float fVar3;
  float fVar4;
  Vec2 VVar5;
  Vec2 VVar6;
  undefined4 extraout_XMM0_Db;
  double dVar7;
  undefined4 local_6c;
  float angle;
  Vec2 p2p0;
  Vec2 yaxis;
  undefined4 local_30;
  undefined4 uStack_2c;
  Vec2 xaxis;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *next_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *prev_local;
  vector<miniply::Vec2,_std::allocator<miniply::Vec2>_> *points2D_local;
  uint32_t idx_local;
  
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](next,(ulong)idx);
  pvVar2 = std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::operator[]
                     (points2D,(ulong)*pvVar1);
  VVar5.x = pvVar2->x;
  VVar5.y = pvVar2->y;
  pvVar2 = std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::operator[]
                     (points2D,(ulong)idx);
  VVar6.x = pvVar2->x;
  VVar6.y = pvVar2->y;
  VVar5 = operator-(VVar5,VVar6);
  VVar5 = normalize(VVar5);
  uStack_2c = VVar5.y;
  local_30 = VVar5.x;
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](prev,(ulong)idx);
  pvVar2 = std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::operator[]
                     (points2D,(ulong)*pvVar1);
  lhs.x = pvVar2->x;
  lhs.y = pvVar2->y;
  pvVar2 = std::vector<miniply::Vec2,_std::allocator<miniply::Vec2>_>::operator[]
                     (points2D,(ulong)idx);
  rhs.x = pvVar2->x;
  rhs.y = pvVar2->y;
  VVar6 = operator-(lhs,rhs);
  fVar3 = dot(VVar6,(Vec2)(CONCAT44(local_30,uStack_2c) ^ 0x80000000));
  fVar4 = dot(VVar6,VVar5);
  dVar7 = std::atan2((double)(ulong)(uint)fVar3,(double)CONCAT44(extraout_XMM0_Db,fVar4));
  local_6c = SUB84(dVar7,0);
  if ((local_6c <= 0.0) || (3.1415927 <= local_6c)) {
    local_6c = 10000.0;
  }
  return local_6c;
}

Assistant:

static float angle_at_vert(uint32_t idx,
                             const std::vector<Vec2>& points2D,
                             const std::vector<uint32_t>& prev,
                             const std::vector<uint32_t>& next)
  {
    Vec2 xaxis = normalize(points2D[next[idx]] - points2D[idx]);
    Vec2 yaxis = Vec2{-xaxis.y, xaxis.x};
    Vec2 p2p0 = points2D[prev[idx]] - points2D[idx];
    float angle = std::atan2(dot(p2p0, yaxis), dot(p2p0, xaxis));
    if (angle <= 0.0f || angle >= kPi) {
      angle = 10000.0f;
    }
    return angle;
  }